

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O1

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,size_t max_items)

{
  allocator_type local_29;
  
  *(undefined8 *)((long)&(this->queue_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queue_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->push_cv_);
  std::condition_variable::condition_variable(&this->pop_cv_);
  (this->q_).max_items_ = max_items + 1;
  (this->q_).head_ = 0;
  (this->q_).tail_ = 0;
  (this->q_).overrun_counter_ = 0;
  std::vector<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>::vector
            (&(this->q_).v_,max_items + 1,&local_29);
  return;
}

Assistant:

explicit mpmc_blocking_queue(size_t max_items)
        : q_(max_items)
    {}